

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int make_time(archive_write *a,uint8_t type,uint flg,int ti)

{
  void *pvVar1;
  byte bVar2;
  int iVar3;
  ssize_t sVar4;
  long lVar5;
  ulong uVar6;
  uint8_t b;
  uint8_t filetime [8];
  byte local_39;
  long local_38;
  
  pvVar1 = a->format_data;
  uVar6 = (ulong)(uint)ti;
  lVar5 = *(long *)((long)pvVar1 + uVar6 * 8 + 0x40);
  if (lVar5 == *(long *)((long)pvVar1 + 0x18)) {
    iVar3 = enc_uint64(a,(ulong)type);
    if (iVar3 < 0) {
      return iVar3;
    }
    iVar3 = enc_uint64(a,*(long *)((long)pvVar1 + 0x18) * 8 + 2);
    if (iVar3 < 0) {
      return iVar3;
    }
    iVar3 = enc_uint64(a,1);
  }
  else {
    if (lVar5 == 0) {
      return 0;
    }
    iVar3 = enc_uint64(a,(ulong)type);
    if (iVar3 < 0) {
      return iVar3;
    }
    iVar3 = enc_uint64(a,(*(long *)((long)pvVar1 + 0x18) + 7U >> 3) +
                         *(long *)((long)pvVar1 + uVar6 * 8 + 0x40) * 8 + 2);
    if (iVar3 < 0) {
      return iVar3;
    }
    iVar3 = enc_uint64(a,0);
    if (iVar3 < 0) {
      return iVar3;
    }
    local_39 = 0;
    lVar5 = *(long *)((long)pvVar1 + 0xf110);
    if (lVar5 == 0) goto LAB_0044add9;
    bVar2 = 0x80;
    do {
      if ((*(uint *)(lVar5 + 0x38) & flg) != 0) {
        local_39 = local_39 | bVar2;
      }
      if (bVar2 < 2) {
        sVar4 = compress_out(a,&local_39,1,ARCHIVE_Z_RUN);
        if ((int)sVar4 < 0) {
          return (int)sVar4;
        }
        local_39 = 0;
        bVar2 = 0x80;
      }
      else {
        bVar2 = bVar2 >> 1;
      }
      lVar5 = *(long *)(lVar5 + 0x18);
    } while (lVar5 != 0);
    sVar4 = compress_out(a,&local_39,1,ARCHIVE_Z_RUN);
    iVar3 = (int)sVar4;
  }
  if (iVar3 < 0) {
    return iVar3;
  }
LAB_0044add9:
  iVar3 = enc_uint64(a,0);
  if (iVar3 < 0) {
    return iVar3;
  }
  lVar5 = *(long *)((long)pvVar1 + 0xf110);
  if (lVar5 != 0) {
    do {
      if ((*(uint *)(lVar5 + 0x38) & flg) != 0) {
        local_38 = *(long *)(lVar5 + 0x48 + uVar6 * 0x10) / 100 +
                   *(long *)(lVar5 + 0x40 + uVar6 * 0x10) * 10000000 + 0x19db1ded53e8000;
        sVar4 = compress_out(a,&local_38,8,ARCHIVE_Z_RUN);
        if ((int)sVar4 < 0) {
          return (int)sVar4;
        }
      }
      lVar5 = *(long *)(lVar5 + 0x18);
    } while (lVar5 != 0);
  }
  return 0;
}

Assistant:

static int
make_time(struct archive_write *a, uint8_t type, unsigned flg, int ti)
{
	uint8_t filetime[8];
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;
	uint8_t b, mask;

	/*
	 * Make Time Bools.
	 */
	if (zip->total_number_time_defined[ti] == zip->total_number_entry) {
		/* Write Time Type. */
		r = enc_uint64(a, type);
		if (r < 0)
			return (r);
		/* Write EmptyStream Size. */
		r = enc_uint64(a, 2 + zip->total_number_entry * 8);
		if (r < 0)
			return (r);
		/* All are defined. */
		r = enc_uint64(a, 1);
		if (r < 0)
			return (r);
	} else {
		if (zip->total_number_time_defined[ti] == 0)
			return (ARCHIVE_OK);

		/* Write Time Type. */
		r = enc_uint64(a, type);
		if (r < 0)
			return (r);
		/* Write EmptyStream Size. */
		r = enc_uint64(a, 2 + ((zip->total_number_entry + 7) >> 3)
			+ zip->total_number_time_defined[ti] * 8);
		if (r < 0)
			return (r);

		/* All are not defined. */
		r = enc_uint64(a, 0);
		if (r < 0)
			return (r);

		b = 0;
		mask = 0x80;
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->flg & flg)
				b |= mask;
			mask >>= 1;
			if (mask == 0) {
				r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
				mask = 0x80;
				b = 0;
			}
		}
		if (mask != 0x80) {
			r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);
		}
	}

	/* External. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);


	/*
	 * Make Times.
	 */
	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		if ((file->flg & flg) == 0)
			continue;
		archive_le64enc(filetime, utcToFiletime(file->times[ti].time,
			file->times[ti].time_ns));
		r = (int)compress_out(a, filetime, 8, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	return (ARCHIVE_OK);
}